

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildCallCommon
          (IRBuilder *this,Instr *instr,StackSym *symDst,ArgSlot argCount,CallFlags flags)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  ArgSlot AVar5;
  uint byteCodeOffset;
  undefined4 *puVar6;
  Opnd *pOVar7;
  IntConstOpnd *pIVar8;
  long lVar9;
  uint local_44;
  Instr *pIStack_40;
  int count;
  Instr *prevInstr;
  Instr *argInstr;
  OpCode newOpcode;
  CallFlags flags_local;
  ArgSlot argCount_local;
  StackSym *symDst_local;
  Instr *instr_local;
  IRBuilder *this_local;
  
  OVar1 = instr->m_opcode;
  local_44 = 0;
  bVar3 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&this->m_argStack->
                      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1a7b,"(!m_argStack->Empty())","!m_argStack->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  prevInstr = SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Pop(this->m_argStack);
  pIStack_40 = instr;
  while( true ) {
    bVar3 = false;
    if (prevInstr != (Instr *)0x0) {
      bVar4 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        (&this->m_argStack->
                          super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
      bVar3 = false;
      if (!bVar4) {
        bVar3 = prevInstr->m_opcode != StartCall;
      }
    }
    if (!bVar3) break;
    pOVar7 = IR::Instr::GetDst(prevInstr);
    IR::Instr::SetSrc2(pIStack_40,pOVar7);
    pIStack_40 = prevInstr;
    local_44 = local_44 + 1;
    prevInstr = SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Pop(this->m_argStack);
  }
  if ((prevInstr != (Instr *)0x0) && (prevInstr->m_opcode != StartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1a86,
                       "(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall)",
                       "argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&this->m_argStack->
                      super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  if (bVar3) {
    this->callTreeHasSomeProfileInfo = false;
  }
  if ((((OVar1 == NewScObject) || (OVar1 == NewScObjArray)) || (OVar1 == NewScObjectSpread)) ||
     (OVar1 == NewScObjArraySpread)) {
    local_44 = local_44 + 1;
    this->m_argsOnStack = this->m_argsOnStack + 1;
  }
  AVar5 = Js::CallInfo::GetArgCountWithExtraArgs(flags,(uint)argCount);
  if (prevInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1aa3,"(false)","Expect StartCall on other opcodes...");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  else {
    pOVar7 = IR::Instr::GetDst(prevInstr);
    IR::Instr::SetSrc2(pIStack_40,pOVar7);
    if (instr->m_prev->m_opcode != LdSpreadIndices) {
      pOVar7 = IR::Instr::GetSrc1(prevInstr);
      bVar3 = IR::Opnd::IsIntConstOpnd(pOVar7);
      if (bVar3) {
        pOVar7 = IR::Instr::GetSrc1(prevInstr);
        pIVar8 = IR::Opnd::AsIntConstOpnd(pOVar7);
        lVar9 = IR::EncodableOpnd<long>::GetValue(&pIVar8->super_EncodableOpnd<long>);
        if ((lVar9 == (int)local_44) && (local_44 == AVar5)) goto LAB_0064eee8;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1a9f,
                         "(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices || (argInstr->GetSrc1()->IsIntConstOpnd() && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count && count == argCount))"
                         ,"StartCall has wrong number of arguments...");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
LAB_0064eee8:
  this->m_callsOnStack = this->m_callsOnStack - 1;
  if (this->m_func->m_argSlotsForFunctionsCalled < this->m_argsOnStack) {
    this->m_func->m_argSlotsForFunctionsCalled = this->m_argsOnStack;
  }
  if ((this->m_callsOnStack == 0) && (this->m_argsOnStack != (uint)AVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1aaf,"(m_argsOnStack == argCount)","m_argsOnStack == argCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  this->m_argsOnStack = this->m_argsOnStack - (uint)AVar5;
  bVar3 = Func::IsJitInDebugMode(this->m_func);
  if (bVar3) {
    byteCodeOffset = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
    InsertBailOutForDebugger(this,byteCodeOffset,c_debuggerBailOutKindForCall,(Instr *)0x0);
  }
  return;
}

Assistant:

void
IRBuilder::BuildCallCommon(IR::Instr * instr, StackSym * symDst, Js::ArgSlot argCount, Js::CallFlags flags)
{
    Js::OpCode newOpcode = instr->m_opcode;

    IR::Instr *     argInstr = nullptr;
    IR::Instr *     prevInstr = instr;
#if DBG
    int count = 0;
#endif

    // Link all the args of this call by creating a def/use chain through the src2.
    AssertOrFailFast(!m_argStack->Empty());
    for (argInstr = m_argStack->Pop();
        argInstr && !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall;
        argInstr = m_argStack->Pop())
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
#if DBG
        count++;
#endif
    }
    AssertOrFailFast(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall);

    if (m_argStack->Empty())
    {
        this->callTreeHasSomeProfileInfo = false;
    }

    if (newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjArray
        || newOpcode == Js::OpCode::NewScObjectSpread || newOpcode == Js::OpCode::NewScObjArraySpread)
    {
#if DBG
        count++;
#endif
        m_argsOnStack++;
    }

    argCount = Js::CallInfo::GetArgCountWithExtraArgs(flags, argCount);

    if (argInstr)
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        AssertMsg(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices
            // All non-spread calls need StartCall to have the same number of args
            || (argInstr->GetSrc1()->IsIntConstOpnd()
                    && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count
                    && count == argCount), "StartCall has wrong number of arguments...");
    }
    else
    {
        AssertMsg(false, "Expect StartCall on other opcodes...");
    }

    // Update Func if this is the highest amount of stack we've used so far
    // to push args.
#if DBG
    m_callsOnStack--;
#endif
    if (m_func->m_argSlotsForFunctionsCalled < m_argsOnStack)
        m_func->m_argSlotsForFunctionsCalled = m_argsOnStack;
#if DBG
    if (m_callsOnStack == 0)
        Assert(m_argsOnStack == argCount);
#endif
    m_argsOnStack -= argCount;

    if (m_func->IsJitInDebugMode())
    {
        // Insert bailout after return from a call, script or library function call.
        this->InsertBailOutForDebugger(
            m_jnReader.GetCurrentOffset(), // bailout will resume at the offset of next instr.
            c_debuggerBailOutKindForCall);
    }
}